

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::Write_2(ON_Mesh *this,int Vcount,ON_BinaryArchive *file)

{
  int iVar1;
  ON_3fPoint *pOVar2;
  ON_3fVector *pOVar3;
  ON_2fPoint *pOVar4;
  ON_SurfaceCurvature *pOVar5;
  ON_Color *pOVar6;
  bool bVar7;
  endian eVar8;
  ulong count;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  eVar8 = ON_BinaryArchive::Endian(file);
  iVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if (iVar1 < Vcount) {
    return false;
  }
  if (0 < Vcount) {
    uVar10 = 0;
    if (iVar1 == (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count) {
      uVar10 = (ulong)(uint)Vcount;
    }
    uVar11 = 0;
    if (iVar1 == (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count) {
      uVar11 = Vcount;
    }
    uVar12 = 0;
    if (iVar1 == (this->m_K).m_count) {
      uVar12 = Vcount;
    }
    uVar9 = 0;
    if (iVar1 == (this->m_C).m_count) {
      uVar9 = Vcount;
    }
    count = (ulong)uVar9;
    if (eVar8 == big_endian) {
      pOVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uint)(Vcount * 3),4,pOVar2,pOVar2);
      pOVar3 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uint)((int)uVar10 * 3),4,pOVar3,pOVar3);
      pOVar4 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uVar11 * 2),4,pOVar4,pOVar4);
      pOVar5 = (this->m_K).m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uVar12 * 2),8,pOVar5,pOVar5);
      pOVar6 = (this->m_C).m_a;
      ON_BinaryArchive::ToggleByteOrder(count,4,pOVar6,pOVar6);
    }
    bVar7 = ON_BinaryArchive::WriteCompressedBuffer
                      (file,(ulong)(uint)Vcount * 0xc,
                       (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a);
    if ((((bVar7) &&
         (bVar7 = ON_BinaryArchive::WriteCompressedBuffer
                            (file,uVar10 * 0xc,(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a),
         bVar7)) &&
        (bVar7 = ON_BinaryArchive::WriteCompressedBuffer
                           (file,(ulong)uVar11 << 3,(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a
                           ), bVar7)) &&
       (bVar7 = ON_BinaryArchive::WriteCompressedBuffer(file,(ulong)uVar12 << 4,(this->m_K).m_a),
       bVar7)) {
      bVar7 = ON_BinaryArchive::WriteCompressedBuffer(file,count * 4,(this->m_C).m_a);
    }
    else {
      bVar7 = false;
    }
    if (eVar8 == big_endian) {
      pOVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uint)(Vcount * 3),4,pOVar2,pOVar2);
      pOVar3 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uint)((int)uVar10 * 3),4,pOVar3,pOVar3);
      pOVar4 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uVar11 * 2),4,pOVar4,pOVar4);
      pOVar5 = (this->m_K).m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uVar12 * 2),8,pOVar5,pOVar5);
      pOVar6 = (this->m_C).m_a;
      ON_BinaryArchive::ToggleByteOrder(count,4,pOVar6,pOVar6);
    }
    return bVar7;
  }
  return true;
}

Assistant:

bool ON_Mesh::Write_2( int Vcount, ON_BinaryArchive& file ) const
{
  // ver 2.0 compressed format
  const ON::endian e = file.Endian();

  bool rc = true;

  if ( Vcount > m_V.Count() )
    return false;

  if ( Vcount > 0 ) 
  {
    const int Ncount = (m_V.Count() == m_N.Count()) ? Vcount : 0;
    const int Tcount = (m_V.Count() == m_T.Count()) ? Vcount : 0;
    const int Kcount = (m_V.Count() == m_K.Count()) ? Vcount : 0;
    const int Ccount = (m_V.Count() == m_C.Count()) ? Vcount : 0;

    if (e == ON::endian::big_endian)
    {
      // These calls temporarily put the m_V[], m_N[], m_T[], m_K[]
      // and m_C[] arrays in little endian byte order because 3dm archives
      // are always in little endian byte order.
      //
      // This code assumes sizeof(ON_Color)=4, sizeof(float)=4 
      // and sizeof(double)=8.
      // If this is not the case, then changing the 4's and 8's below
      // will not work.  You will have to copy the mesh definition
      // into temporary arrays of 4 byte floats/8 byte doubles
      // and them compress the temporary arrays.  If you do this,
      // then remove the "restore" byte order calls below.
      file.ToggleByteOrder( Vcount*3, 4, m_V.Array(), (void*)m_V.Array() );
      file.ToggleByteOrder( Ncount*3, 4, m_N.Array(), (void*)m_N.Array() );
      file.ToggleByteOrder( Tcount*2, 4, m_T.Array(), (void*)m_T.Array() );
      file.ToggleByteOrder( Kcount*2, 8, m_K.Array(), (void*)m_K.Array() );
      file.ToggleByteOrder( Ccount,   4, m_C.Array(), (void*)m_C.Array() );
    }
    if (rc) rc = file.WriteCompressedBuffer( Vcount*sizeof(ON_3fPoint),         m_V.Array() );
    if (rc) rc = file.WriteCompressedBuffer( Ncount*sizeof(ON_3fVector),        m_N.Array() );
    if (rc) rc = file.WriteCompressedBuffer( Tcount*sizeof(ON_2fPoint),         m_T.Array() );
    if (rc) rc = file.WriteCompressedBuffer( Kcount*sizeof(ON_SurfaceCurvature),m_K.Array() );
    if (rc) rc = file.WriteCompressedBuffer( Ccount*sizeof(ON_Color),           m_C.Array() );
    if (e == ON::endian::big_endian)
    {
      // These calls restore the m_V[], m_N[], m_T[], m_K[] and m_C[] arrays
      // to the correct big endian runtime byte order.  This must be done even
      // if rc is false.
      file.ToggleByteOrder( Vcount*3, 4, m_V.Array(), (void*)m_V.Array() );
      file.ToggleByteOrder( Ncount*3, 4, m_N.Array(), (void*)m_N.Array() );
      file.ToggleByteOrder( Tcount*2, 4, m_T.Array(), (void*)m_T.Array() );
      file.ToggleByteOrder( Kcount*2, 8, m_K.Array(), (void*)m_K.Array() );
      file.ToggleByteOrder( Ccount,   4, m_C.Array(), (void*)m_C.Array() );
    }
  }

  return rc;
}